

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

void mg_path_destroy_ca(mg_path *path,mg_allocator *allocator)

{
  mg_node *in_RSI;
  uint *in_RDI;
  uint32_t i_1;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  uint uVar2;
  
  if (in_RDI != (uint *)0x0) {
    for (uVar2 = 0; uVar2 < *in_RDI; uVar2 = uVar2 + 1) {
      mg_node_destroy_ca(in_RSI,(mg_allocator *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    }
    for (uVar1 = 0; uVar1 < in_RDI[1]; uVar1 = uVar1 + 1) {
      mg_unbound_relationship_destroy_ca
                ((mg_unbound_relationship *)in_RSI,(mg_allocator *)CONCAT44(uVar2,uVar1));
    }
    mg_allocator_free((mg_allocator *)in_RSI,(void *)CONCAT44(uVar2,uVar1));
  }
  return;
}

Assistant:

void mg_path_destroy_ca(mg_path *path, mg_allocator *allocator) {
  if (!path) {
    return;
  }
  for (uint32_t i = 0; i < path->node_count; ++i) {
    mg_node_destroy_ca(path->nodes[i], allocator);
  }
  for (uint32_t i = 0; i < path->relationship_count; ++i) {
    mg_unbound_relationship_destroy_ca(path->relationships[i], allocator);
  }
  mg_allocator_free(allocator, path);
}